

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2unummax(long *val,char *str,long max)

{
  ParameterError result;
  long max_local;
  char *str_local;
  long *val_local;
  
  val_local._4_4_ = str2unum(val,str);
  if (val_local._4_4_ == PARAM_OK) {
    if (max < *val) {
      val_local._4_4_ = PARAM_NUMBER_TOO_LARGE;
    }
    else {
      val_local._4_4_ = PARAM_OK;
    }
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2unummax(long *val, const char *str, long max)
{
  ParameterError result = str2unum(val, str);
  if(result != PARAM_OK)
    return result;
  if(*val > max)
    return PARAM_NUMBER_TOO_LARGE;

  return PARAM_OK;
}